

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O2

void flavor_assign_random(uint8_t tval)

{
  int iVar1;
  flavor *pfVar2;
  uint32_t uVar3;
  flavor **ppfVar4;
  wchar_t flavor_count;
  uint32_t m;
  ulong uVar5;
  
  m = 0;
  ppfVar4 = &flavors;
  while (pfVar2 = *ppfVar4, pfVar2 != (flavor *)0x0) {
    if (pfVar2->tval == tval) {
      m = m + (pfVar2->sval == '\0');
    }
    ppfVar4 = &pfVar2->next;
  }
  uVar5 = 0;
  do {
    if (z_info->k_max <= uVar5) {
      return;
    }
    if ((k_info[uVar5].tval == (uint)tval) && (k_info[uVar5].flavor == (flavor *)0x0)) {
      if (m == 0) {
        quit_fmt("Not enough flavors for tval %d.",(ulong)tval);
      }
      uVar3 = Rand_div(m);
      ppfVar4 = &flavors;
      while (pfVar2 = *ppfVar4, pfVar2 != (flavor *)0x0) {
        if ((pfVar2->tval == tval) && (pfVar2->sval == '\0')) {
          if (uVar3 == 0) {
            k_info[uVar5].flavor = pfVar2;
            iVar1 = k_info[uVar5].sval;
            pfVar2->sval = (uint8_t)iVar1;
            if (tval == '\x19') {
              pfVar2->text = scroll_adj[iVar1];
            }
            m = m - 1;
            break;
          }
          uVar3 = uVar3 - 1;
        }
        ppfVar4 = &pfVar2->next;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void flavor_assign_random(uint8_t tval)
{
	int i;
	int flavor_count = 0;
	int choice;
	struct flavor *f;

	/* Count the random flavors for the given tval */
	for (f = flavors; f; f = f->next)
		if (f->tval == tval && f->sval == SV_UNKNOWN)
			flavor_count++;

	for (i = 0; i < z_info->k_max; i++) {
		if (k_info[i].tval != tval || k_info[i].flavor)
			continue;

		if (!flavor_count)
			quit_fmt("Not enough flavors for tval %d.", tval);

		choice = randint0(flavor_count);
	
		for (f = flavors; f; f = f->next) {
			if (f->tval != tval || f->sval != SV_UNKNOWN)
				continue;

			if (choice == 0) {
				k_info[i].flavor = f;
				f->sval = k_info[i].sval;
				if (tval == TV_SCROLL)
					f->text = scroll_adj[k_info[i].sval];
				flavor_count--;
				break;
			}

			choice--;
		}
	}
}